

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

char * mi_heap_strdup(mi_heap_t *heap,char *s)

{
  mi_heap_t *heap_00;
  char *in_RSI;
  char *t;
  size_t len;
  size_t in_stack_ffffffffffffffd8;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    heap_00 = (mi_heap_t *)_mi_strlen(in_RSI);
    local_8 = (char *)mi_heap_malloc(heap_00,in_stack_ffffffffffffffd8);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      _mi_memcpy(heap_00,local_8,0x14ac86c);
      local_8[(long)heap_00] = '\0';
    }
  }
  return local_8;
}

Assistant:

char* mi_heap_strdup(mi_heap_t* heap, const char* s) mi_attr_noexcept {
  if (s == NULL) return NULL;
  size_t len = _mi_strlen(s);
  char* t = (char*)mi_heap_malloc(heap,len+1);
  if (t == NULL) return NULL;
  _mi_memcpy(t, s, len);
  t[len] = 0;
  return t;
}